

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

bool CaseInsensitiveEqual(string *s1,string *s2)

{
  byte bVar1;
  size_type sVar2;
  byte bVar3;
  byte bVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  if (s1->_M_string_length == s2->_M_string_length) {
    sVar2 = 0;
    do {
      bVar5 = s1->_M_string_length == sVar2;
      if (bVar5) break;
      bVar1 = (s1->_M_dataplus)._M_p[sVar2];
      bVar3 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar3 = bVar1;
      }
      bVar1 = (s2->_M_dataplus)._M_p[sVar2];
      bVar4 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar4 = bVar1;
      }
      sVar2 = sVar2 + 1;
    } while (bVar3 == bVar4);
  }
  else {
    bVar5 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CaseInsensitiveEqual(const std::string& s1, const std::string& s2)
{
    if (s1.size() != s2.size()) return false;
    for (size_t i = 0; i < s1.size(); ++i) {
        char c1 = s1[i];
        if (c1 >= 'A' && c1 <= 'Z') c1 -= ('A' - 'a');
        char c2 = s2[i];
        if (c2 >= 'A' && c2 <= 'Z') c2 -= ('A' - 'a');
        if (c1 != c2) return false;
    }
    return true;
}